

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void av1_rd_pick_palette_intra_sby
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int dc_mode_cost,
               MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
               int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
               PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map)

{
  uint uVar1;
  int iVar2;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int64_t *in_R9;
  int64_t *in_stack_00000008;
  undefined8 in_stack_00000018;
  int last_n_searched;
  int min_n_1;
  int max_n_1;
  int step_size_stage2;
  int end_n_stage2;
  int start_n_stage2;
  int k_means_winner;
  int stage2_step_size;
  int stage2_max_n;
  int stage2_min_n;
  int top_color_winner;
  int step_size;
  int min_n;
  int max_n;
  uint8_t step_size_lookup_table [9];
  uint8_t start_n_lookup_table [9];
  _Bool do_header_rd_based_gating;
  int16_t top_colors [8];
  int n_cache;
  uint16_t color_cache [16];
  int upper_bound;
  int lower_bound;
  int16_t centroids [8];
  int16_t *data;
  int64_t norm_color_dist;
  int color_thresh_palette;
  uint8_t *color_map;
  int count_buf_8bit [256];
  int colors_threshold;
  int colors;
  int count_buf [4096];
  int unused;
  int discount_color_cost;
  int bit_depth;
  int is_hbd;
  SequenceHeader *seq_params;
  int cols;
  int rows;
  int block_height;
  int block_width;
  uint8_t *src;
  int src_stride;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffb6e0;
  undefined4 in_stack_ffffffffffffb6e4;
  undefined4 in_stack_ffffffffffffb6e8;
  undefined4 in_stack_ffffffffffffb6ec;
  undefined8 in_stack_ffffffffffffb6f0;
  undefined8 in_stack_ffffffffffffb6f8;
  int iVar3;
  uint8_t *in_stack_ffffffffffffb700;
  int *in_stack_ffffffffffffb710;
  int *in_stack_ffffffffffffb718;
  int *in_stack_ffffffffffffb720;
  uint16_t *in_stack_ffffffffffffb728;
  int *in_stack_ffffffffffffb730;
  MACROBLOCKD *in_stack_ffffffffffffb738;
  undefined1 in_stack_ffffffffffffb777;
  undefined4 in_stack_ffffffffffffb778;
  undefined4 in_stack_ffffffffffffb77c;
  int in_stack_ffffffffffffb780;
  BLOCK_SIZE in_stack_ffffffffffffb787;
  undefined4 in_stack_ffffffffffffb788;
  undefined4 in_stack_ffffffffffffb78c;
  undefined4 in_stack_ffffffffffffb790;
  undefined4 in_stack_ffffffffffffb794;
  AV1_COMP *in_stack_ffffffffffffb798;
  int16_t *in_stack_ffffffffffffb7b0;
  int in_stack_ffffffffffffb7b8;
  uint16_t *in_stack_ffffffffffffb7c0;
  int in_stack_ffffffffffffb7c8;
  undefined8 in_stack_ffffffffffffb7d0;
  undefined1 do_header_rd_based_gating_00;
  undefined4 in_stack_ffffffffffffb7d8;
  undefined4 in_stack_ffffffffffffb7dc;
  undefined4 uVar4;
  int in_stack_ffffffffffffb7e0;
  undefined4 in_stack_ffffffffffffb7e4;
  BLOCK_SIZE BVar5;
  undefined4 in_stack_ffffffffffffb7e8;
  undefined4 in_stack_ffffffffffffb7ec;
  uint uVar6;
  MACROBLOCK *in_stack_ffffffffffffb7f0;
  MACROBLOCK *x_00;
  AV1_COMP *in_stack_ffffffffffffb7f8;
  AV1_COMP *cpi_00;
  undefined4 in_stack_ffffffffffffb800;
  undefined4 in_stack_ffffffffffffb804;
  uint8_t *in_stack_ffffffffffffb808;
  int *in_stack_ffffffffffffb810;
  PICK_MODE_CONTEXT *in_stack_ffffffffffffb818;
  uint8_t *in_stack_ffffffffffffb820;
  uint8_t *in_stack_ffffffffffffb828;
  undefined4 in_stack_ffffffffffffb830;
  undefined4 in_stack_ffffffffffffb834;
  int in_stack_ffffffffffffb840;
  undefined4 in_stack_ffffffffffffb844;
  int in_stack_ffffffffffffb848;
  int in_stack_ffffffffffffb850;
  int in_stack_ffffffffffffb858;
  int in_stack_ffffffffffffb860;
  int *in_stack_ffffffffffffb868;
  undefined4 in_stack_ffffffffffffb870;
  undefined4 in_stack_ffffffffffffb874;
  uint16_t *in_stack_ffffffffffffb878;
  int in_stack_ffffffffffffb880;
  undefined4 in_stack_ffffffffffffb884;
  MB_MODE_INFO *in_stack_ffffffffffffb888;
  int64_t *in_stack_ffffffffffffb890;
  undefined4 in_stack_ffffffffffffb898;
  int in_stack_ffffffffffffb89c;
  int *in_stack_ffffffffffffb8a0;
  int64_t *in_stack_ffffffffffffb8a8;
  int64_t *in_stack_ffffffffffffb8b0;
  int in_stack_ffffffffffffb8b8;
  undefined4 in_stack_ffffffffffffb8bc;
  undefined4 uVar7;
  PICK_MODE_CONTEXT *in_stack_ffffffffffffb8c0;
  PICK_MODE_CONTEXT *ctx_00;
  undefined4 in_stack_ffffffffffffb8c8;
  undefined4 in_stack_ffffffffffffb8cc;
  undefined4 uVar8;
  uint8_t *in_stack_ffffffffffffb8d0;
  uint8_t *tx_type_map_00;
  uint8_t *in_stack_ffffffffffffb8d8;
  uint8_t *tx_type_map_01;
  undefined4 in_stack_ffffffffffffb8e0;
  undefined4 in_stack_ffffffffffffb8e4;
  int iVar9;
  int in_stack_ffffffffffffb8e8;
  int *piVar10;
  int in_stack_ffffffffffffb8f0;
  int discount_color_cost_00;
  int64_t *piVar11;
  int local_46f8;
  int local_4598;
  undefined1 local_4584 [76];
  undefined1 local_4538 [72];
  int local_44f0;
  int local_44ec;
  _Bool local_44e8 [16];
  int16_t *local_44d8;
  long local_44d0;
  int local_44c4;
  uint8_t *local_44c0;
  int local_40b0;
  int local_40ac;
  undefined1 local_a0 [52];
  int local_6c;
  void *local_68;
  MACROBLOCKD *local_60;
  int64_t *local_58;
  int *local_50;
  BLOCK_SIZE local_41;
  long local_40;
  long local_38;
  
  do_header_rd_based_gating_00 = (undefined1)((ulong)in_stack_ffffffffffffb7d0 >> 0x38);
  local_60 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_68 = (void *)**(long **)(in_RSI + 0x2058);
  local_6c = *(int *)(in_RSI + 0x48);
  local_a0._40_8_ = *(undefined8 *)(in_RSI + 0x30);
  local_58 = in_R9;
  local_50 = in_R8;
  local_41 = in_DL;
  local_40 = in_RSI;
  local_38 = in_RDI;
  av1_get_block_dimensions
            (in_DL,0,local_60,(int *)(local_a0 + 0x24),(int *)(local_a0 + 0x20),
             (int *)(local_a0 + 0x1c),(int *)(local_a0 + 0x18));
  local_a0._16_8_ = *(long *)(local_38 + 0x42008);
  local_a0._13_3_ = 0;
  local_a0[0xc] = *(byte *)(local_a0._16_8_ + 0x4c);
  local_a0._8_4_ = *(int_mv *)(local_a0._16_8_ + 0x48);
  local_a0._4_4_ = *(int *)(local_38 + 0x60cb0);
  local_40b0 = 0;
  iVar9 = (int)((ulong)in_stack_ffffffffffffb6f0 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffb6f8 >> 0x20);
  if (local_a0._12_4_ == 0) {
    av1_count_colors(in_stack_ffffffffffffb700,iVar3,(int)in_stack_ffffffffffffb6f8,iVar9,
                     (int *)CONCAT44(in_stack_ffffffffffffb6ec,in_stack_ffffffffffffb6e8),
                     (int *)CONCAT44(in_stack_ffffffffffffb6e4,in_stack_ffffffffffffb6e0));
    local_40b0 = local_40ac;
  }
  else {
    av1_count_colors_highbd
              (in_stack_ffffffffffffb700,iVar3,(int)in_stack_ffffffffffffb6f8,iVar9,
               (int)in_stack_ffffffffffffb6f0,
               (int *)CONCAT44(in_stack_ffffffffffffb6ec,in_stack_ffffffffffffb6e8),
               in_stack_ffffffffffffb710,in_stack_ffffffffffffb718,in_stack_ffffffffffffb720);
  }
  local_44c0 = local_60->plane[0].color_index_map;
  local_44c4 = *(int *)(local_40 + 0x25630);
  if ((((*(int *)(local_38 + 0x60cb0) != 0) && ((*(byte *)(local_38 + 0x60ddf) & 1) != 0)) &&
      (*(int *)(local_38 + 0x607b0) != 0)) && (0x32 < *(uint *)(local_40 + 0x25640))) {
    local_44d0 = 0;
    if (((*(char *)(local_40 + 0x25626) != '\0') || (*(char *)(local_40 + 0x25627) != '\0')) &&
       ((local_44d0 = *(long *)(local_40 + 0x25628) >> (""[local_41] + ""[local_41] & 0x3f),
        *(char *)(local_40 + 0x25626) != '\0' && (*(char *)(local_40 + 0x25627) != '\0')))) {
      local_44d0 = local_44d0 >> 1;
    }
    if (local_44d0 < 8000) {
      local_44c4 = local_44c4 + 0x14;
    }
  }
  if ((1 < local_40b0) && (local_40b0 <= local_44c4)) {
    local_44d8 = (int16_t *)(*(long *)(local_40 + 0x41c0) + 0x1000);
    fill_data_and_get_bounds
              ((uint8_t *)local_a0._40_8_,local_6c,local_a0._28_4_,local_a0._24_4_,local_a0._12_4_,
               local_44d8,&local_44ec,&local_44f0);
    *(undefined1 *)((long)local_68 + 2) = 0;
    *(undefined1 *)((long)local_68 + 0x5b) = 0;
    local_4538._28_4_ =
         av1_get_palette_cache
                   (in_stack_ffffffffffffb738,(int)((ulong)in_stack_ffffffffffffb730 >> 0x20),
                    in_stack_ffffffffffffb728);
    memset(local_4538,0,0x10);
    find_top_colors(in_stack_ffffffffffffb730,(int)((ulong)in_stack_ffffffffffffb728 >> 0x20),
                    (int)in_stack_ffffffffffffb728,(int16_t *)in_stack_ffffffffffffb720);
    local_4584[0x4b] = *(int *)(local_38 + 0x60ba0) != 0;
    BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffb7e4 >> 0x18);
    if ((*(int *)(local_38 + 0x60b9c) == 1) && (2 < local_40ac)) {
      local_4584._66_8_ = 0x303020303000000;
      local_4584[0x4a] = 2;
      local_4584._57_8_ = 0x303030303000000;
      local_4584[0x41] = 3;
      if (local_40ac < 8) {
        local_4598 = local_40ac;
      }
      else {
        local_4598 = 8;
      }
      local_4584._52_4_ = local_4598;
      local_4584._48_4_ = ZEXT14((byte)local_4584[(long)local_4598 + 0x42]);
      local_4584._44_4_ = ZEXT14((byte)local_4584[(long)local_4598 + 0x39]);
      local_4584._40_4_ =
           perform_top_color_palette_search
                     (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                      (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                      BVar5,in_stack_ffffffffffffb7e0,
                      (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                      (int16_t *)CONCAT44(in_stack_ffffffffffffb844,in_stack_ffffffffffffb840),
                      in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                      (_Bool)do_header_rd_based_gating_00,in_stack_ffffffffffffb868,
                      (uint16_t *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                      (int)in_stack_ffffffffffffb878,
                      (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb884,in_stack_ffffffffffffb880),
                      &in_stack_ffffffffffffb888->bsize,in_stack_ffffffffffffb890,
                      (int *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                      in_stack_ffffffffffffb8a0,in_stack_ffffffffffffb8a8,
                      (uint8_t *)in_stack_ffffffffffffb8b0,
                      (int *)CONCAT44(in_stack_ffffffffffffb8bc,in_stack_ffffffffffffb8b8),
                      in_stack_ffffffffffffb8c0,
                      (uint8_t *)CONCAT44(in_stack_ffffffffffffb8cc,in_stack_ffffffffffffb8c8),
                      in_stack_ffffffffffffb8d0,(int)in_stack_ffffffffffffb8d8);
      BVar5 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffb7e4 >> 0x18);
      if ((int)local_4584._40_4_ <= (int)local_4584._52_4_) {
        set_stage2_params((int *)(local_4584 + 0x24),(int *)(local_4584 + 0x20),
                          (int *)(local_4584 + 0x1c),local_4584._40_4_,local_4584._52_4_);
        perform_top_color_palette_search
                  (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                   (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                   BVar5,in_stack_ffffffffffffb7e0,
                   (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                   (int16_t *)CONCAT44(in_stack_ffffffffffffb844,in_stack_ffffffffffffb840),
                   in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                   (_Bool)do_header_rd_based_gating_00,in_stack_ffffffffffffb868,
                   (uint16_t *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                   (int)in_stack_ffffffffffffb878,
                   (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb884,in_stack_ffffffffffffb880),
                   &in_stack_ffffffffffffb888->bsize,in_stack_ffffffffffffb890,
                   (int *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                   in_stack_ffffffffffffb8a0,in_stack_ffffffffffffb8a8,
                   (uint8_t *)in_stack_ffffffffffffb8b0,
                   (int *)CONCAT44(in_stack_ffffffffffffb8bc,in_stack_ffffffffffffb8b8),
                   in_stack_ffffffffffffb8c0,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffb8cc,in_stack_ffffffffffffb8c8),
                   in_stack_ffffffffffffb8d0,(int)in_stack_ffffffffffffb8d8);
      }
      local_4584._24_4_ =
           perform_k_means_palette_search
                     (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                      (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                      BVar5,in_stack_ffffffffffffb7e0,
                      (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                      in_stack_ffffffffffffb840,in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,
                      in_stack_ffffffffffffb858,in_stack_ffffffffffffb860,
                      (_Bool)do_header_rd_based_gating_00,
                      (int *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                      in_stack_ffffffffffffb878,in_stack_ffffffffffffb880,in_stack_ffffffffffffb888,
                      (uint8_t *)in_stack_ffffffffffffb890,
                      (int64_t *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                      in_stack_ffffffffffffb8a0,(int *)in_stack_ffffffffffffb8a8,
                      in_stack_ffffffffffffb8b0,
                      (uint8_t *)CONCAT44(in_stack_ffffffffffffb8bc,in_stack_ffffffffffffb8b8),
                      (int *)in_stack_ffffffffffffb8c0,
                      (PICK_MODE_CONTEXT *)
                      CONCAT44(in_stack_ffffffffffffb8cc,in_stack_ffffffffffffb8c8),
                      in_stack_ffffffffffffb8d0,in_stack_ffffffffffffb8d8,
                      (uint8_t *)CONCAT44(in_stack_ffffffffffffb8e4,in_stack_ffffffffffffb8e0),
                      in_stack_ffffffffffffb8e8,in_stack_ffffffffffffb8f0);
      if ((int)local_4584._24_4_ <= (int)local_4584._52_4_) {
        set_stage2_params((int *)(local_4584 + 0x14),(int *)(local_4584 + 0x10),
                          (int *)(local_4584 + 0xc),local_4584._24_4_,local_4584._52_4_);
        perform_k_means_palette_search
                  (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                   (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                   BVar5,in_stack_ffffffffffffb7e0,
                   (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                   in_stack_ffffffffffffb840,in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,
                   in_stack_ffffffffffffb858,in_stack_ffffffffffffb860,
                   (_Bool)do_header_rd_based_gating_00,
                   (int *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                   in_stack_ffffffffffffb878,in_stack_ffffffffffffb880,in_stack_ffffffffffffb888,
                   (uint8_t *)in_stack_ffffffffffffb890,
                   (int64_t *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                   in_stack_ffffffffffffb8a0,(int *)in_stack_ffffffffffffb8a8,
                   in_stack_ffffffffffffb8b0,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffb8bc,in_stack_ffffffffffffb8b8),
                   (int *)in_stack_ffffffffffffb8c0,
                   (PICK_MODE_CONTEXT *)
                   CONCAT44(in_stack_ffffffffffffb8cc,in_stack_ffffffffffffb8c8),
                   in_stack_ffffffffffffb8d0,in_stack_ffffffffffffb8d8,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffb8e4,in_stack_ffffffffffffb8e0),
                   in_stack_ffffffffffffb8e8,in_stack_ffffffffffffb8f0);
      }
    }
    else {
      if (local_40ac < 8) {
        local_46f8 = local_40ac;
      }
      else {
        local_46f8 = 8;
      }
      local_4584._8_4_ = local_46f8;
      local_4584._4_4_ = 2;
      local_4584._0_4_ = 2;
      ctx_00 = (PICK_MODE_CONTEXT *)local_4538;
      local_46f8 = local_46f8 + 1;
      uVar7 = CONCAT13(local_4584[0x4b],(int3)in_stack_ffffffffffffb8bc);
      tx_type_map_01 = local_4538 + 0x20;
      tx_type_map_00 = local_4584;
      uVar8 = CONCAT13(local_4584[0x4b],(int3)in_stack_ffffffffffffb8cc);
      iVar9 = local_4538._28_4_;
      piVar10 = local_50;
      piVar11 = local_58;
      perform_top_color_palette_search
                (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                 (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),BVar5
                 ,in_stack_ffffffffffffb7e0,
                 (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                 (int16_t *)CONCAT44(in_stack_ffffffffffffb844,in_stack_ffffffffffffb840),
                 in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                 (_Bool)do_header_rd_based_gating_00,in_stack_ffffffffffffb868,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                 (int)in_stack_ffffffffffffb878,
                 (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb884,in_stack_ffffffffffffb880),
                 &in_stack_ffffffffffffb888->bsize,in_stack_ffffffffffffb890,
                 (int *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                 in_stack_ffffffffffffb8a0,in_stack_ffffffffffffb8a8,
                 (uint8_t *)in_stack_ffffffffffffb8b0,
                 (int *)CONCAT44(uVar7,in_stack_ffffffffffffb8b8),ctx_00,
                 (uint8_t *)CONCAT44(uVar8,local_46f8),tx_type_map_00,(int)tx_type_map_01);
      discount_color_cost_00 = (int)piVar11;
      iVar3 = (int)piVar10;
      if ((int)local_4584._0_4_ < (int)local_4584._8_4_) {
        in_stack_ffffffffffffb878 = (uint16_t *)local_4538;
        in_stack_ffffffffffffb890 = (int64_t *)(local_4538 + 0x20);
        in_stack_ffffffffffffb888 = (MB_MODE_INFO *)local_a0;
        in_stack_ffffffffffffb880 = local_4584._8_4_;
        in_stack_ffffffffffffb89c = local_4538._28_4_;
        in_stack_ffffffffffffb8a0 = local_50;
        in_stack_ffffffffffffb8a8 = local_58;
        in_stack_ffffffffffffb8b8 = local_a0._4_4_;
        perform_top_color_palette_search
                  (in_stack_ffffffffffffb7f8,in_stack_ffffffffffffb7f0,
                   (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                   (BLOCK_SIZE)((uint)in_stack_ffffffffffffb7e4 >> 0x18),in_stack_ffffffffffffb7e0,
                   (int16_t *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                   (int16_t *)CONCAT44(in_stack_ffffffffffffb844,in_stack_ffffffffffffb840),
                   in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                   (_Bool)do_header_rd_based_gating_00,in_stack_ffffffffffffb868,
                   (uint16_t *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                   (int)in_stack_ffffffffffffb878,
                   (MB_MODE_INFO *)CONCAT44(local_4584._0_4_,local_4584._8_4_),
                   (uint8_t *)in_stack_ffffffffffffb888,in_stack_ffffffffffffb890,
                   (int *)CONCAT44(local_4538._28_4_,in_stack_ffffffffffffb898),local_50,local_58,
                   (uint8_t *)in_stack_00000008,(int *)CONCAT44(uVar7,local_a0._4_4_),ctx_00,
                   (uint8_t *)CONCAT44(uVar8,local_46f8),tx_type_map_00,(int)tx_type_map_01);
        in_stack_ffffffffffffb8b0 = in_stack_00000008;
      }
      if (local_40ac == 2) {
        local_44e8._0_2_ = (undefined2)local_44ec;
        local_44e8._2_2_ = (undefined2)local_44f0;
        palette_rd_y(in_stack_ffffffffffffb798,
                     (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffb794,in_stack_ffffffffffffb790),
                     (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb78c,in_stack_ffffffffffffb788),
                     in_stack_ffffffffffffb787,in_stack_ffffffffffffb780,
                     (int16_t *)CONCAT44(in_stack_ffffffffffffb77c,in_stack_ffffffffffffb778),
                     in_stack_ffffffffffffb7b0,in_stack_ffffffffffffb7b8,in_stack_ffffffffffffb7c0,
                     in_stack_ffffffffffffb7c8,(_Bool)in_stack_ffffffffffffb777,
                     (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffb7dc,in_stack_ffffffffffffb7d8),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffb7e4,in_stack_ffffffffffffb7e0),
                     (int64_t *)CONCAT44(in_stack_ffffffffffffb7ec,in_stack_ffffffffffffb7e8),
                     (int *)in_stack_ffffffffffffb7f0,(int *)in_stack_ffffffffffffb7f8,
                     (int64_t *)CONCAT44(in_stack_ffffffffffffb804,in_stack_ffffffffffffb800),
                     in_stack_ffffffffffffb808,in_stack_ffffffffffffb810,in_stack_ffffffffffffb818,
                     in_stack_ffffffffffffb820,in_stack_ffffffffffffb828,
                     (int *)CONCAT44(in_stack_ffffffffffffb834,in_stack_ffffffffffffb830),local_44e8
                     ,in_stack_ffffffffffffb840);
      }
      else {
        local_4584._0_4_ = 2;
        iVar2 = local_4584._8_4_ + 1;
        uVar4 = CONCAT13(local_4584[0x4b],(int3)in_stack_ffffffffffffb7dc);
        cpi_00 = (AV1_COMP *)(local_4538 + 0x20);
        x_00 = (MACROBLOCK *)local_4584;
        uVar1 = CONCAT13(local_4584[0x4b],(int3)in_stack_ffffffffffffb7ec);
        uVar6 = uVar1 & 0x1ffffff;
        perform_k_means_palette_search
                  (cpi_00,x_00,(MB_MODE_INFO *)(CONCAT44(uVar1,iVar2) & 0x1ffffffffffffff),
                   (BLOCK_SIZE)((uint)local_44f0 >> 0x18),local_44ec,
                   (int16_t *)CONCAT44(uVar4,in_stack_ffffffffffffb7d8),in_stack_ffffffffffffb840,
                   in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                   in_stack_ffffffffffffb860,(_Bool)do_header_rd_based_gating_00,
                   (int *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                   in_stack_ffffffffffffb878,in_stack_ffffffffffffb880,in_stack_ffffffffffffb888,
                   (uint8_t *)in_stack_ffffffffffffb890,
                   (int64_t *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                   in_stack_ffffffffffffb8a0,(int *)in_stack_ffffffffffffb8a8,
                   in_stack_ffffffffffffb8b0,(uint8_t *)CONCAT44(uVar7,in_stack_ffffffffffffb8b8),
                   (int *)ctx_00,(PICK_MODE_CONTEXT *)CONCAT44(uVar8,local_46f8),tx_type_map_00,
                   tx_type_map_01,(uint8_t *)CONCAT44(iVar9,in_stack_ffffffffffffb8e0),iVar3,
                   discount_color_cost_00);
        if ((int)local_4584._0_4_ < (int)local_4584._8_4_) {
          perform_k_means_palette_search
                    (cpi_00,x_00,(MB_MODE_INFO *)CONCAT44(uVar6,iVar2),
                     (BLOCK_SIZE)((uint)local_44f0 >> 0x18),local_44ec,
                     (int16_t *)CONCAT44(uVar4,local_a0._4_4_),in_stack_ffffffffffffb840,
                     in_stack_ffffffffffffb848,in_stack_ffffffffffffb850,in_stack_ffffffffffffb858,
                     in_stack_ffffffffffffb860,SUB81((ulong)in_stack_00000018 >> 0x38,0),
                     (int *)CONCAT44(in_stack_ffffffffffffb874,in_stack_ffffffffffffb870),
                     in_stack_ffffffffffffb878,in_stack_ffffffffffffb880,in_stack_ffffffffffffb888,
                     (uint8_t *)in_stack_ffffffffffffb890,
                     (int64_t *)CONCAT44(in_stack_ffffffffffffb89c,in_stack_ffffffffffffb898),
                     in_stack_ffffffffffffb8a0,(int *)in_stack_ffffffffffffb8a8,
                     in_stack_ffffffffffffb8b0,(uint8_t *)CONCAT44(uVar7,in_stack_ffffffffffffb8b8),
                     (int *)ctx_00,(PICK_MODE_CONTEXT *)CONCAT44(uVar8,local_46f8),tx_type_map_00,
                     tx_type_map_01,(uint8_t *)CONCAT44(iVar9,in_stack_ffffffffffffb8e0),iVar3,
                     discount_color_cost_00);
        }
      }
    }
  }
  if (*(char *)((long)local_50 + 0x8e) != '\0') {
    memcpy(local_44c0,local_58,(long)(int)(local_a0._36_4_ * local_a0._32_4_));
    *(int *)(local_40 + 0x25690) = local_a0._36_4_ * local_a0._32_4_ + *(int *)(local_40 + 0x25690);
  }
  memcpy(local_68,local_50,0xb0);
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sby(
    const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, int dc_mode_cost,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *best_blk_skip,
    uint8_t *tx_type_map) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           bsize));
  assert(PALETTE_MAX_SIZE == 8);
  assert(PALETTE_MIN_SIZE == 2);

  const int src_stride = x->plane[0].src.stride;
  const uint8_t *const src = x->plane[0].src.buf;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  const int is_hbd = seq_params->use_highbitdepth;
  const int bit_depth = seq_params->bit_depth;
  const int discount_color_cost = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int unused;

  int count_buf[1 << 12];  // Maximum (1 << 12) color levels.
  int colors, colors_threshold = 0;
  if (is_hbd) {
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src, src_stride, rows, cols, bit_depth, count_buf,
                            count_buf_8bit, &colors_threshold, &colors);
  } else {
    av1_count_colors(src, src_stride, rows, cols, count_buf, &colors);
    colors_threshold = colors;
  }

  uint8_t *const color_map = xd->plane[0].color_index_map;
  int color_thresh_palette = x->color_palette_thresh;
  // Allow for larger color_threshold for palette search, based on color,
  // scene_change, and block source variance.
  // Since palette is Y based, only allow larger threshold if block
  // color_dist is below threshold.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      cpi->sf.rt_sf.increase_color_thresh_palette && cpi->rc.high_source_sad &&
      x->source_variance > 50) {
    int64_t norm_color_dist = 0;
    if (x->color_sensitivity[0] || x->color_sensitivity[1]) {
      norm_color_dist = x->min_dist_inter_uv >>
                        (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
      if (x->color_sensitivity[0] && x->color_sensitivity[1])
        norm_color_dist = norm_color_dist >> 1;
    }
    if (norm_color_dist < 8000) color_thresh_palette += 20;
  }
  if (colors_threshold > 1 && colors_threshold <= color_thresh_palette) {
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[PALETTE_MAX_SIZE];
    int lower_bound, upper_bound;
    fill_data_and_get_bounds(src, src_stride, rows, cols, is_hbd, data,
                             &lower_bound, &upper_bound);

    mbmi->mode = DC_PRED;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;

    uint16_t color_cache[2 * PALETTE_MAX_SIZE];
    const int n_cache = av1_get_palette_cache(xd, 0, color_cache);

    // Find the dominant colors, stored in top_colors[].
    int16_t top_colors[PALETTE_MAX_SIZE] = { 0 };
    find_top_colors(count_buf, bit_depth, AOMMIN(colors, PALETTE_MAX_SIZE),
                    top_colors);

    // The following are the approaches used for header rdcost based gating
    // for early termination for different values of prune_palette_search_level.
    // 0: Pruning based on header rdcost for ascending order palette_size
    // search.
    // 1: When colors > PALETTE_MIN_SIZE, enabled only for coarse palette_size
    // search and for finer search do_header_rd_based_gating parameter is
    // explicitly passed as 'false'.
    // 2: Enabled only for ascending order palette_size search and for
    // descending order search do_header_rd_based_gating parameter is explicitly
    // passed as 'false'.
    const bool do_header_rd_based_gating =
        cpi->sf.intra_sf.prune_luma_palette_size_search_level != 0;

    // TODO(huisu@google.com): Try to avoid duplicate computation in cases
    // where the dominant colors and the k-means results are similar.
    if ((cpi->sf.intra_sf.prune_palette_search_level == 1) &&
        (colors > PALETTE_MIN_SIZE)) {
      // Start index and step size below are chosen to evaluate unique
      // candidates in neighbor search, in case a winner candidate is found in
      // coarse search. Example,
      // 1) 8 colors (end_n = 8): 2,3,4,5,6,7,8. start_n is chosen as 2 and step
      // size is chosen as 3. Therefore, coarse search will evaluate 2, 5 and 8.
      // If winner is found at 5, then 4 and 6 are evaluated. Similarly, for 2
      // (3) and 8 (7).
      // 2) 7 colors (end_n = 7): 2,3,4,5,6,7. If start_n is chosen as 2 (same
      // as for 8 colors) then step size should also be 2, to cover all
      // candidates. Coarse search will evaluate 2, 4 and 6. If winner is either
      // 2 or 4, 3 will be evaluated. Instead, if start_n=3 and step_size=3,
      // coarse search will evaluate 3 and 6. For the winner, unique neighbors
      // (3: 2,4 or 6: 5,7) would be evaluated.

      // Start index for coarse palette search for dominant colors and k-means
      const uint8_t start_n_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                   3, 3, 2,
                                                                   3, 3, 2 };
      // Step size for coarse palette search for dominant colors and k-means
      const uint8_t step_size_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                     3, 3, 3,
                                                                     3, 3, 3 };

      // Choose the start index and step size for coarse search based on number
      // of colors
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE);
      const int min_n = start_n_lookup_table[max_n];
      const int step_size = step_size_lookup_table[max_n];
      assert(min_n >= PALETTE_MIN_SIZE);
      // Perform top color coarse palette search to find the winner candidate
      const int top_color_winner = perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          step_size, do_header_rd_based_gating, &unused, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for dominant colors
      if (top_color_winner <= max_n) {
        int stage2_min_n, stage2_max_n, stage2_step_size;
        set_stage2_params(&stage2_min_n, &stage2_max_n, &stage2_step_size,
                          top_color_winner, max_n);
        // perform finer search for the winner candidate
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, stage2_min_n,
            stage2_max_n + 1, stage2_step_size,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      // Perform k-means coarse palette search to find the winner candidate
      const int k_means_winner = perform_k_means_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
          min_n, max_n + 1, step_size, do_header_rd_based_gating, &unused,
          color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
          rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
          best_blk_skip, tx_type_map, color_map, rows * cols,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for k-means
      if (k_means_winner <= max_n) {
        int start_n_stage2, end_n_stage2, step_size_stage2;
        set_stage2_params(&start_n_stage2, &end_n_stage2, &step_size_stage2,
                          k_means_winner, max_n);
        // perform finer search for the winner candidate
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            start_n_stage2, end_n_stage2 + 1, step_size_stage2,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, color_map, rows * cols, discount_color_cost);
      }
    } else {
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE),
                min_n = PALETTE_MIN_SIZE;
      // Perform top color palette search in ascending order
      int last_n_searched = min_n;
      perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          1, do_header_rd_based_gating, &last_n_searched, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      if (last_n_searched < max_n) {
        // Search in descending order until we get to the previous best
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, max_n,
            last_n_searched, -1, /*do_header_rd_based_gating=*/false, &unused,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      if (colors == PALETTE_MIN_SIZE) {
        // Special case: These colors automatically become the centroids.
        assert(colors == 2);
        centroids[0] = lower_bound;
        centroids[1] = upper_bound;
        palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, colors,
                     color_cache, n_cache, /*do_header_rd_based_gating=*/false,
                     best_mbmi, best_palette_color_map, best_rd, rate,
                     rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
                     best_blk_skip, tx_type_map, NULL, NULL,
                     discount_color_cost);
      } else {
        // Perform k-means palette search in ascending order
        last_n_searched = min_n;
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            min_n, max_n + 1, 1, do_header_rd_based_gating, &last_n_searched,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, color_map, rows * cols,
            discount_color_cost);
        if (last_n_searched < max_n) {
          // Search in descending order until we get to the previous best
          perform_k_means_palette_search(
              cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
              max_n, last_n_searched, -1, /*do_header_rd_based_gating=*/false,
              &unused, color_cache, n_cache, best_mbmi, best_palette_color_map,
              best_rd, rate, rate_tokenonly, distortion, skippable,
              beat_best_rd, ctx, best_blk_skip, tx_type_map, color_map,
              rows * cols, discount_color_cost);
        }
      }
    }
  }

  if (best_mbmi->palette_mode_info.palette_size[0] > 0) {
    memcpy(color_map, best_palette_color_map,
           block_width * block_height * sizeof(best_palette_color_map[0]));
    // Gather the stats to determine whether to use screen content tools in
    // function av1_determine_sc_tools_with_encoding().
    x->palette_pixels += (block_width * block_height);
  }
  *mbmi = *best_mbmi;
}